

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O0

void __thiscall
cppcms::triggers_recorder::triggers_recorder(triggers_recorder *this,cache_interface *cache)

{
  cache_interface *in_RSI;
  triggers_recorder *in_RDI;
  triggers_recorder *tr;
  cache_interface *in_stack_ffffffffffffffe0;
  
  tr = in_RDI;
  booster::noncopyable::noncopyable((noncopyable *)in_RDI);
  booster::hold_ptr<cppcms::triggers_recorder::data>::hold_ptr(&tr->d);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x40ff33);
  in_RDI->cache_ = in_RSI;
  cache_interface::add_triggers_recorder(in_stack_ffffffffffffffe0,tr);
  return;
}

Assistant:

triggers_recorder::triggers_recorder(cache_interface &cache):
	cache_(&cache)
{
	cache_->add_triggers_recorder(this);
}